

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

bool __thiscall
BlockFilterIndex::LookupFilterHeader
          (BlockFilterIndex *this,CBlockIndex *block_index,uint256 *header_out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  iterator iVar5;
  int iVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  DBVal entry;
  unique_lock<std::mutex> uStack_b8;
  uint256 local_a8;
  DBVal local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_b8,&this->m_cs_headers_cache,
             "m_cs_headers_cache",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
             ,0x1af,false);
  iVar6 = block_index->nHeight % 1000;
  if (iVar6 == 0) {
    CBlockIndex::GetBlockHash(&local_88.hash,block_index);
    iVar5 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_uint256>,_std::allocator<std::pair<const_uint256,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_FilterHeaderHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_headers_cache)._M_h,&local_88.hash);
    if (iVar5.super__Node_iterator_base<std::pair<const_uint256,_uint256>,_true>._M_cur !=
        (__node_type *)0x0) {
      uVar1 = *(undefined8 *)
               ((long)iVar5.super__Node_iterator_base<std::pair<const_uint256,_uint256>,_true>.
                      _M_cur + 0x28);
      uVar2 = *(undefined8 *)
               ((long)iVar5.super__Node_iterator_base<std::pair<const_uint256,_uint256>,_true>.
                      _M_cur + 0x30);
      uVar3 = *(undefined8 *)
               ((long)iVar5.super__Node_iterator_base<std::pair<const_uint256,_uint256>,_true>.
                      _M_cur + 0x40);
      *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x10) =
           *(undefined8 *)
            ((long)iVar5.super__Node_iterator_base<std::pair<const_uint256,_uint256>,_true>._M_cur +
            0x38);
      *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar3;
      *(undefined8 *)(header_out->super_base_blob<256U>).m_data._M_elems = uVar1;
      *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 8) = uVar2;
      bVar4 = true;
      goto LAB_006ddd08;
    }
  }
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_88.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_88.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_88.pos.nFile = -1;
  local_88.pos.nPos = 0;
  bVar4 = LookupOne(&((this->m_db)._M_t.
                      super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t
                      .super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                      super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper,
                    block_index,&local_88);
  if (bVar4) {
    if ((iVar6 == 0) && ((this->m_headers_cache)._M_h._M_element_count < 2000)) {
      CBlockIndex::GetBlockHash(&local_a8,block_index);
      std::
      _Hashtable<uint256,std::pair<uint256_const,uint256>,std::allocator<std::pair<uint256_const,uint256>>,std::__detail::_Select1st,std::equal_to<uint256>,FilterHeaderHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<uint256,uint256&>
                ((_Hashtable<uint256,std::pair<uint256_const,uint256>,std::allocator<std::pair<uint256_const,uint256>>,std::__detail::_Select1st,std::equal_to<uint256>,FilterHeaderHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->m_headers_cache,&local_a8,&local_88.header);
    }
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_88.header.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_88.header.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(header_out->super_base_blob<256U>).m_data._M_elems =
         local_88.header.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((header_out->super_base_blob<256U>).m_data._M_elems + 8) =
         local_88.header.super_base_blob<256U>.m_data._M_elems._8_8_;
  }
LAB_006ddd08:
  std::unique_lock<std::mutex>::~unique_lock(&uStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::LookupFilterHeader(const CBlockIndex* block_index, uint256& header_out)
{
    LOCK(m_cs_headers_cache);

    bool is_checkpoint{block_index->nHeight % CFCHECKPT_INTERVAL == 0};

    if (is_checkpoint) {
        // Try to find the block in the headers cache if this is a checkpoint height.
        auto header = m_headers_cache.find(block_index->GetBlockHash());
        if (header != m_headers_cache.end()) {
            header_out = header->second;
            return true;
        }
    }

    DBVal entry;
    if (!LookupOne(*m_db, block_index, entry)) {
        return false;
    }

    if (is_checkpoint &&
        m_headers_cache.size() < CF_HEADERS_CACHE_MAX_SZ) {
        // Add to the headers cache if this is a checkpoint height.
        m_headers_cache.emplace(block_index->GetBlockHash(), entry.header);
    }

    header_out = entry.header;
    return true;
}